

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::~QStyleSheetStyle(QStyleSheetStyle *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR_metaObject_007f7fd8;
  numinstances = numinstances + -1;
  if ((numinstances == 0) && (styleSheetCaches != (QStyleSheetStyleCaches *)0x0)) {
    (**(code **)(*(long *)styleSheetCaches + 0x20))();
  }
  piVar1 = *(int **)(this + 0x48);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x48),2,0x10);
    }
  }
  QArrayDataPointer<QCss::Symbol>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::Symbol> *)(this + 0x20));
  QWindowsStyle::~QWindowsStyle((QWindowsStyle *)this);
  return;
}

Assistant:

QStyleSheetStyle::~QStyleSheetStyle()
{
    --numinstances;
    if (numinstances == 0) {
        delete styleSheetCaches;
    }
}